

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner2.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::IGXMLScanner::normalizeAttRawValue
          (IGXMLScanner *this,XMLCh *attrName,XMLCh *value,XMLBuffer *toFill)

{
  XMLReader *this_00;
  bool bVar1;
  XMLCh *local_38;
  XMLCh *srcPtr;
  XMLCh nextCh;
  bool escaped;
  bool retVal;
  XMLBuffer *toFill_local;
  XMLCh *value_local;
  XMLCh *attrName_local;
  IGXMLScanner *this_local;
  
  srcPtr._7_1_ = true;
  XMLBuffer::reset(toFill);
  for (local_38 = value; *local_38 != L'\0'; local_38 = local_38 + 1) {
    srcPtr._4_2_ = *local_38;
    bVar1 = srcPtr._4_2_ == L'\xffff';
    if (bVar1) {
      srcPtr._4_2_ = local_38[1];
      local_38 = local_38 + 1;
    }
    else if (*local_38 == L'<') {
      XMLScanner::emitError
                (&this->super_XMLScanner,BracketInAttrValue,attrName,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
      srcPtr._7_1_ = false;
    }
    if (!bVar1) {
      this_00 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
      bVar1 = XMLReader::isWhitespace(this_00,srcPtr._4_2_);
      if (bVar1) {
        srcPtr._4_2_ = L' ';
      }
    }
    XMLBuffer::append(toFill,srcPtr._4_2_);
  }
  return srcPtr._7_1_;
}

Assistant:

bool IGXMLScanner::normalizeAttRawValue( const   XMLCh* const        attrName
                                      , const XMLCh* const        value
                                      ,       XMLBuffer&          toFill)
{
    // Assume its going to go fine, and empty the target buffer in preperation
    bool retVal = true;
    toFill.reset();

    //  Loop through the chars of the source value and normalize it according
    //  to the type.
    bool escaped;
    XMLCh nextCh;
    const XMLCh* srcPtr = value;
    while (*srcPtr)
    {
        //  Get the next character from the source. We have to watch for
        //  escaped characters (which are indicated by a 0xFFFF value followed
        //  by the char that was escaped.)
        nextCh = *srcPtr;
        escaped = (nextCh == 0xFFFF);
        if (escaped)
            nextCh = *++srcPtr;

        //  If its not escaped, then make sure its not a < character, which is
        //  not allowed in attribute values.
        if (!escaped && (*srcPtr == chOpenAngle))
        {
            emitError(XMLErrs::BracketInAttrValue, attrName);
            retVal = false;
        }

        if (!escaped)
        {
            //  NOTE: Yes this is a little redundant in that a 0x20 is
            //  replaced with an 0x20. But its faster to do this (I think)
            //  than checking for 9, A, and D separately.
            if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                nextCh = chSpace;
        }

        // Add this char to the target buffer
        toFill.append(nextCh);

        // And move up to the next character in the source
        srcPtr++;
    }
    return retVal;
}